

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int idx_buffer_old_size;
  int vtx_buffer_old_size;
  ImDrawCmd *draw_cmd;
  int new_size;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  if ((0xffff < (uint)(in_RDI[0xd] + in_EDX)) && ((in_RDI[0xc] & 8U) != 0)) {
    in_RDI[0x28] = in_RDI[8];
    _OnChangedVtxOffset((ImDrawList *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
    ;
  }
  lVar1 = *(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38;
  *(int *)(lVar1 + 0x20) = in_ESI + *(int *)(lVar1 + 0x20);
  iVar3 = in_RDI[8];
  new_size = (int)((ulong)in_RDI >> 0x20);
  ImVector<ImDrawVert>::resize
            ((ImVector<ImDrawVert> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),new_size);
  *(long *)(in_RDI + 0x12) = *(long *)(in_RDI + 10) + (long)iVar3 * 0x14;
  iVar2 = in_RDI[4];
  ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)CONCAT44(iVar3,iVar2),new_size);
  *(long *)(in_RDI + 0x14) = *(long *)(in_RDI + 6) + (long)iVar2 * 2;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        // FIXME: In theory we should be testing that vtx_count <64k here.
        // In practice, RenderText() relies on reserving ahead for a worst case scenario so it is currently useful for us
        // to not make that check until we rework the text functions to handle clipping and large horizontal lines better.
        _CmdHeader.VtxOffset = VtxBuffer.Size;
        _OnChangedVtxOffset();
    }

    ImDrawCmd* draw_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd->ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}